

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DBSCAN.cpp
# Opt level: O0

void __thiscall DBSCAN::SetArrivalEmbs(DBSCAN *this,Embedding *emb)

{
  ulong uVar1;
  uint uVar2;
  reference pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar4;
  size_type sVar5;
  float fVar6;
  value_type local_1088 [4];
  Embedding local_1078;
  Embedding local_850;
  float local_24;
  ulong uStack_20;
  float distance;
  unsigned_long i;
  Embedding *emb_local;
  DBSCAN *this_local;
  
  i = (unsigned_long)emb;
  emb_local = (Embedding *)this;
  for (uStack_20 = 0; uStack_20 < this->emb_num; uStack_20 = uStack_20 + 1) {
    pvVar3 = std::vector<Embedding,_std::allocator<Embedding>_>::operator[](&this->embs,uStack_20);
    Embedding::Embedding(&local_850,pvVar3);
    Embedding::Embedding(&local_1078,(Embedding *)i);
    fVar6 = GetDistance(this,&local_850,&local_1078);
    Embedding::~Embedding(&local_1078);
    Embedding::~Embedding(&local_850);
    uVar1 = uStack_20;
    local_24 = fVar6;
    if (this->radius <= fVar6) {
      uVar2 = Embedding::GetEmbID((Embedding *)i);
      if (uVar1 != uVar2) {
        pvVar4 = Embedding::GetArrivalEmbs((Embedding *)i);
        local_1088[0] = (value_type)uStack_20;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar4,local_1088);
      }
    }
  }
  pvVar4 = Embedding::GetArrivalEmbs((Embedding *)i);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar4);
  if (sVar5 < this->min_embs) {
    Embedding::SetKey((Embedding *)i,false);
  }
  else {
    Embedding::SetKey((Embedding *)i,true);
  }
  return;
}

Assistant:

void DBSCAN::SetArrivalEmbs(Embedding& emb)
{
    for(unsigned long i=0; i<this->emb_num; i++)                //对每个数据点执行
    {
        float distance = this->GetDistance(embs[i], emb);    //获取与特定点之间的距离
        if(distance >= radius && i!=emb.GetEmbID())        //若距离小于半径，并且特定点的id与dp的id不同执行
            emb.GetArrivalEmbs().push_back(i);            //将特定点id压力dp的领域列表中
    }
    if(emb.GetArrivalEmbs().size() >= this->min_embs)            //若dp领域内数据点数据量> minPTs执行
    {
        emb.SetKey(true);    //将dp核心对象标志位设为true
        return;                //返回
    }
    emb.SetKey(false);    //若非核心对象，则将dp核心对象标志位设为false
}